

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

void __thiscall
mprpc::MpRpcServer::on_recv
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,char *data,size_t size)

{
  undefined8 *puVar1;
  element_type *peVar2;
  iterator iVar3;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  rep rVar5;
  MsgPackPacker pk;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  unique_lock<std::recursive_mutex> lock;
  __shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  MpRpcMessage::parse((MpRpcMessage *)&rpcmsg,data,size);
  if (((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) &&
      ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id != 0)
      ) && (((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            method)._M_string_length != 0)) {
    std::unique_lock<std::recursive_mutex>::unique_lock(&lock,(mutex_type *)(this + 8));
    (**(code **)(*(long *)(conn->
                          super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 0x10))(&pk);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(this + 0x30),(key_type *)&pk);
    std::__cxx11::string::~string((string *)&pk);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      (**(code **)(*(long *)(conn->
                            super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr + 0x10))(&pk);
      p_Var4 = &std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(this + 0x30),(key_type *)&pk)->
                super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var4,&conn->
                         super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>);
      std::__cxx11::string::~string((string *)&pk);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
    rVar5 = std::chrono::_V2::system_clock::now();
    ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->recv_time)
    .__d.__r = rVar5;
    if (((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->method
        )._M_string_length == 0) {
      pk.sb.size = 0;
      pk.sb.data = (char *)0x0;
      pk.sb.alloc = 0;
      pk.pk.callback = msgpack_sbuffer_write;
      lock._M_device._0_1_ = 0x82;
      pk.pk.data = &pk;
      msgpack_sbuffer_write(&pk,(char *)&lock,1);
      MsgPackPacker::pack_map_item
                (&pk,"id",(rpcmsg.
                           super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->id);
      MsgPackPacker::pack_string(&pk,"error",0);
      lock._M_device._0_1_ = 0x82;
      (*pk.pk.callback)(pk.pk.data,(char *)&lock,1);
      MsgPackPacker::pack_map_item(&pk,"code",-1);
      MsgPackPacker::pack_map_item(&pk,"message","empty method");
      peVar2 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (**(code **)(*(long *)peVar2 + 0x20))(peVar2,pk.sb.data,pk.sb.size);
      free(pk.sb.data);
    }
    else {
      puVar1 = *(undefined8 **)this;
      if (puVar1 == (undefined8 *)0x0) {
        std::__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_58,
                   &conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,
                   &rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>);
        std::__cxx11::string::string((string *)&pk,"unknown method",(allocator *)&lock);
        send_error_rsp(this,(shared_ptr<mprpc::ClientConnection> *)&local_58,
                       (shared_ptr<mprpc::MpRpcMessage> *)&local_68,-1,(string *)&pk);
        std::__cxx11::string::~string((string *)&pk);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        p_Var4 = &local_58;
      }
      else {
        std::__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_38,
                   &conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_48,
                   &rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>);
        (**(code **)*puVar1)(puVar1,&local_38,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        p_Var4 = &local_38;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var4->_M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void MpRpcServer::on_recv(shared_ptr<ClientConnection> conn, const char* data, size_t size)
    {
        auto rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg ||
            rpcmsg->id == 0 ||
            rpcmsg->method.empty())
        {
            return;
        }

        {
            unique_lock<recursive_mutex> lock(m_conn_map_lock);
            auto it = m_conn_map.find(conn->id());
            if (it == m_conn_map.end()) m_conn_map[conn->id()] = conn;
        }

        rpcmsg->recv_time = system_clock::now();

        if (rpcmsg->method.size()) {
            if (m_callback)
                m_callback->on_call(conn, rpcmsg);
            else {
                send_error_rsp(conn, rpcmsg, -1, "unknown method");
            }
        }
        else {
            MsgPackPacker pk;
            pk.pack_map(2);
            pk.pack_map_item ("id", rpcmsg->id);
            pk.pack_string   ("error");
            // error -> [ code, message]
            pk.pack_map(2);
            pk.pack_map_item ("code", -1);
            pk.pack_map_item ("message", "empty method");

            conn->send(pk.sb.data, pk.sb.size);
        }
    }